

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O0

void plain_array_suite::remove_back(void)

{
  pointer *ppiVar1;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  iterator iVar2;
  iterator iVar3;
  iterator iVar4;
  iterator iVar5;
  allocator<int> local_265;
  int local_264 [3];
  iterator local_258;
  size_type local_250;
  undefined1 local_248 [8];
  vector<int,_std::allocator<int>_> expect_5;
  allocator<int> local_1f9;
  int local_1f8 [4];
  iterator local_1e8;
  size_type local_1e0;
  undefined1 local_1d8 [8];
  vector<int,_std::allocator<int>_> expect_4;
  allocator<int> local_18d;
  int local_18c;
  iterator local_188;
  size_type local_180;
  undefined1 local_178 [8];
  vector<int,_std::allocator<int>_> expect_3;
  allocator<int> local_129;
  int local_128 [2];
  iterator local_120;
  size_type local_118;
  undefined1 local_110 [8];
  vector<int,_std::allocator<int>_> expect_2;
  undefined1 auStack_c8 [8];
  vector<int,_std::allocator<int>_> expect_1;
  allocator<int> local_65;
  int local_64;
  iterator local_60;
  size_type local_58;
  undefined1 local_50 [8];
  vector<int,_std::allocator<int>_> expect;
  circular_view<int,_18446744073709551615UL> span;
  int array [4];
  
  span.member.next = 0;
  ppiVar1 = &expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  vista::circular_view<int,_18446744073709551615UL>::circular_view<4UL,_0>
            ((circular_view<int,_18446744073709551615UL> *)ppiVar1,
             (value_type (*) [4])&span.member.next);
  vista::circular_view<int,_18446744073709551615UL>::push_back
            ((circular_view<int,_18446744073709551615UL> *)ppiVar1,0xb);
  local_64 = 0xb;
  local_60 = &local_64;
  local_58 = 1;
  std::allocator<int>::allocator(&local_65);
  __l_03._M_len = local_58;
  __l_03._M_array = local_60;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_50,__l_03,&local_65);
  std::allocator<int>::~allocator(&local_65);
  ppiVar1 = &expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  iVar4 = vista::circular_view<int,_18446744073709551615UL>::begin
                    ((circular_view<int,_18446744073709551615UL> *)ppiVar1);
  iVar5 = vista::circular_view<int,_18446744073709551615UL>::end
                    ((circular_view<int,_18446744073709551615UL> *)ppiVar1);
  iVar2 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_50);
  iVar3 = std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)local_50)
  ;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x6c6,"void plain_array_suite::remove_back()",iVar4,iVar5,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar2._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar3._M_current);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_50);
  ppiVar1 = &expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  vista::circular_view<int,_18446744073709551615UL>::remove_back
            ((circular_view<int,_18446744073709551615UL> *)ppiVar1,1);
  auStack_c8 = (undefined1  [8])0x0;
  expect_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  expect_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)auStack_c8);
  iVar4 = vista::circular_view<int,_18446744073709551615UL>::begin
                    ((circular_view<int,_18446744073709551615UL> *)ppiVar1);
  iVar5 = vista::circular_view<int,_18446744073709551615UL>::end
                    ((circular_view<int,_18446744073709551615UL> *)ppiVar1);
  iVar2 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)auStack_c8);
  expect_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)auStack_c8);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x6cc,"void plain_array_suite::remove_back()",iVar4,iVar5,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar2._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             expect_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)auStack_c8);
  ppiVar1 = &expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  vista::circular_view<int,_18446744073709551615UL>::push_back
            ((circular_view<int,_18446744073709551615UL> *)ppiVar1,0xb);
  vista::circular_view<int,_18446744073709551615UL>::push_back
            ((circular_view<int,_18446744073709551615UL> *)ppiVar1,0x16);
  local_128[0] = 0xb;
  local_128[1] = 0x16;
  local_120 = local_128;
  local_118 = 2;
  std::allocator<int>::allocator(&local_129);
  __l_02._M_len = local_118;
  __l_02._M_array = local_120;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_110,__l_02,&local_129);
  std::allocator<int>::~allocator(&local_129);
  ppiVar1 = &expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  iVar4 = vista::circular_view<int,_18446744073709551615UL>::begin
                    ((circular_view<int,_18446744073709551615UL> *)ppiVar1);
  iVar5 = vista::circular_view<int,_18446744073709551615UL>::end
                    ((circular_view<int,_18446744073709551615UL> *)ppiVar1);
  iVar2 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_110);
  expect_3.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)local_110);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x6d3,"void plain_array_suite::remove_back()",iVar4,iVar5,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar2._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             expect_3.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_110);
  vista::circular_view<int,_18446744073709551615UL>::remove_back
            ((circular_view<int,_18446744073709551615UL> *)
             &expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,1);
  local_18c = 0xb;
  local_188 = &local_18c;
  local_180 = 1;
  std::allocator<int>::allocator(&local_18d);
  __l_01._M_len = local_180;
  __l_01._M_array = local_188;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_178,__l_01,&local_18d);
  std::allocator<int>::~allocator(&local_18d);
  ppiVar1 = &expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  iVar4 = vista::circular_view<int,_18446744073709551615UL>::begin
                    ((circular_view<int,_18446744073709551615UL> *)ppiVar1);
  iVar5 = vista::circular_view<int,_18446744073709551615UL>::end
                    ((circular_view<int,_18446744073709551615UL> *)ppiVar1);
  iVar2 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_178);
  expect_4.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)local_178);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x6d9,"void plain_array_suite::remove_back()",iVar4,iVar5,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar2._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             expect_4.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_178);
  ppiVar1 = &expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  vista::circular_view<int,_18446744073709551615UL>::push_back
            ((circular_view<int,_18446744073709551615UL> *)ppiVar1,0x21);
  vista::circular_view<int,_18446744073709551615UL>::push_back
            ((circular_view<int,_18446744073709551615UL> *)ppiVar1,0x2c);
  vista::circular_view<int,_18446744073709551615UL>::push_back
            ((circular_view<int,_18446744073709551615UL> *)ppiVar1,0x37);
  local_1f8[0] = 0xb;
  local_1f8[1] = 0x21;
  local_1f8[2] = 0x2c;
  local_1f8[3] = 0x37;
  local_1e8 = local_1f8;
  local_1e0 = 4;
  std::allocator<int>::allocator(&local_1f9);
  __l_00._M_len = local_1e0;
  __l_00._M_array = local_1e8;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_1d8,__l_00,&local_1f9);
  std::allocator<int>::~allocator(&local_1f9);
  ppiVar1 = &expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  iVar4 = vista::circular_view<int,_18446744073709551615UL>::begin
                    ((circular_view<int,_18446744073709551615UL> *)ppiVar1);
  iVar5 = vista::circular_view<int,_18446744073709551615UL>::end
                    ((circular_view<int,_18446744073709551615UL> *)ppiVar1);
  iVar2 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_1d8);
  expect_5.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)local_1d8);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x6e1,"void plain_array_suite::remove_back()",iVar4,iVar5,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar2._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             expect_5.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_1d8);
  vista::circular_view<int,_18446744073709551615UL>::remove_back
            ((circular_view<int,_18446744073709551615UL> *)
             &expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,1);
  local_264[0] = 0xb;
  local_264[1] = 0x21;
  local_264[2] = 0x2c;
  local_258 = local_264;
  local_250 = 3;
  std::allocator<int>::allocator(&local_265);
  __l._M_len = local_250;
  __l._M_array = local_258;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_248,__l,&local_265);
  std::allocator<int>::~allocator(&local_265);
  ppiVar1 = &expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  iVar4 = vista::circular_view<int,_18446744073709551615UL>::begin
                    ((circular_view<int,_18446744073709551615UL> *)ppiVar1);
  iVar5 = vista::circular_view<int,_18446744073709551615UL>::end
                    ((circular_view<int,_18446744073709551615UL> *)ppiVar1);
  iVar2 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_248);
  iVar3 = std::vector<int,_std::allocator<int>_>::end
                    ((vector<int,_std::allocator<int>_> *)local_248);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x6e7,"void plain_array_suite::remove_back()",iVar4,iVar5,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar2._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar3._M_current);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_248);
  return;
}

Assistant:

void remove_back()
{
    int array[4] = {};
    circular_view<int> span(array);
    span.push_back(11);
    {
        std::vector<int> expect = { 11 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span.remove_back();
    {
        std::vector<int> expect = { };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span.push_back(11);
    span.push_back(22);
    {
        std::vector<int> expect = { 11, 22 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span.remove_back();
    {
        std::vector<int> expect = { 11 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span.push_back(33);
    span.push_back(44);
    span.push_back(55);
    {
        std::vector<int> expect = { 11, 33, 44, 55 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span.remove_back();
    {
        std::vector<int> expect = { 11, 33, 44 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
}